

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O3

int pack(ck_msg_type type,char **buf,CheckMsg *msg)

{
  size_t sVar1;
  
  if (buf == (char **)0x0) {
    sVar1 = 0xffffffff;
  }
  else if (msg == (CheckMsg *)0x0) {
    sVar1 = 0;
  }
  else {
    if (CK_MSG_DURATION < type) {
      eprintf("Bad message type arg %d",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
              ,0x83);
    }
    sVar1 = (*pftab[type])(buf,msg);
    if ((sVar1 & 0xffffffff80000000) != 0) {
      eprintf("Value of len (%d) too big, max allowed %u\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
              ,0x85,sVar1,0x7fffffff);
    }
  }
  return (int)sVar1;
}

Assistant:

int pack(enum ck_msg_type type, char **buf, CheckMsg * msg)
{
    size_t len;

    if(buf == NULL)
        return -1;
    if(msg == NULL)
        return 0;

    check_type(type, __FILE__, __LINE__);

    len = pftab[type] (buf, msg);
    if(len > (size_t) INT_MAX)
        eprintf("Value of len (%d) too big, max allowed %u\n",
                __FILE__, __LINE__ - 3, len, INT_MAX);
    return (int) len;
}